

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbits.cpp
# Opt level: O2

void testpercents(wins *wins_ar,int ar_len)

{
  Am_Drawonable *pAVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  char local_71;
  Am_Image_Array my_diamond_image;
  Am_Style my_diamond_fill;
  Am_Image_Array local_40 [8];
  Am_Image_Array local_38 [8];
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    uVar3 = uVar2;
  }
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    pAVar1 = wins_ar[uVar2].d2;
    bVar6 = 0;
    local_71 = '\n';
    uVar5 = 0;
    iVar4 = 0;
    for (uVar7 = 0; uVar7 < 100; uVar7 = uVar7 + 6) {
      Am_Image_Array::Am_Image_Array(&my_diamond_image,uVar7);
      Am_Image_Array::Am_Image_Array(local_38,&my_diamond_image);
      Am_Style::Am_Style(&my_diamond_fill,"red",8,1,0,1,&Am_DEFAULT_DASH_LIST,2,2,0,local_38);
      Am_Image_Array::~Am_Image_Array(local_38);
      uVar5 = (uint)(byte)(local_71 + (bVar6 / 3) * -0x5a);
      iVar4 = (byte)((char)(((ushort)uVar7 & 0xff) / 0x12) * '\x1d') + 8;
      (**(code **)(*(long *)pAVar1 + 0x160))
                (pAVar1,&Am_No_Style,&my_diamond_fill,uVar5,iVar4,0x19,0x19,0);
      Am_Style::~Am_Style(&my_diamond_fill);
      Am_Image_Array::~Am_Image_Array(&my_diamond_image);
      local_71 = local_71 + '\x1e';
      bVar6 = bVar6 + 1;
    }
    Am_Image_Array::Am_Image_Array(&my_diamond_image,testpercents::my_diamond_bits,0x10,0x10);
    Am_Image_Array::Am_Image_Array(local_40,&my_diamond_image);
    Am_Style::Am_Style(&my_diamond_fill,"red",8,1,0,1,&Am_DEFAULT_DASH_LIST,2,2,0,local_40);
    Am_Image_Array::~Am_Image_Array(local_40);
    (**(code **)(*(long *)pAVar1 + 0x160))
              (pAVar1,&Am_Black,&my_diamond_fill,uVar5 + 0x1e,iVar4,0x19,0x19,0);
    Am_Style::~Am_Style(&my_diamond_fill);
    Am_Image_Array::~Am_Image_Array(&my_diamond_image);
  }
  return;
}

Assistant:

void
testpercents(wins *wins_ar, int ar_len)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *d = wins_ar[i].d2;

    int final_left = 0;
    int final_top = 0;

    for (int n = 0; n < 100; n = n + 6) {
      Am_Image_Array image_array(n);
      Am_Style image_style("red", 8, Am_CAP_BUTT, Am_JOIN_MITER,
                           Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                           Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                           Am_FILL_POLY_EVEN_ODD, image_array);
      int left = 10 + (((n / 6) % 3) * 30);
      int top = 8 + (((n / 6) / 3) * 29);
      d->Draw_Rectangle(Am_No_Style, image_style, left, top, 25, 25);
      final_left = left;
      final_top = top;
    }

    /*
    static char my_diamond_bits[] = {
        0x80, 0x00, 0xc0, 0x01, 0xe0, 0x03, 0xf0, 0x07, 0xf8, 0x0f, 0xfc, 0x1f,
        0xfe, 0x3f, 0xff, 0x7f, 0xfe, 0x3f, 0xfc, 0x1f, 0xf8, 0x0f, 0xf0, 0x07,
        0xe0, 0x03, 0xc0, 0x01, 0x80, 0x00, 0x00, 0x00};
*/
    static char my_diamond_bits[] = {
        '\200', '\0',  '\300', '\1',  '\340', '\3',  '\360', '\7',
        '\370', '\17', '\374', '\37', '\376', '\77', '\377', '\177',
        '\376', '\77', '\374', '\37', '\370', '\17', '\360', '\7',
        '\340', '\3',  '\300', '\1',  '\200', '\0',  '\0',   '\0'};

    // Style from image array

    Am_Image_Array my_diamond_image(my_diamond_bits, 16, 16);
    Am_Style my_diamond_fill("red", 8, Am_CAP_BUTT, Am_JOIN_MITER,
                             Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                             Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                             Am_FILL_POLY_EVEN_ODD, my_diamond_image);

    d->Draw_Rectangle(Am_Black, my_diamond_fill, final_left + 30, final_top, 25,
                      25);
  }
}